

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

UBool equal_uint32(uint32_t *s,uint32_t *t,int32_t length)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = length >> 0x1f & length;
  lVar2 = 0;
  do {
    if (length < 1) {
LAB_002fa8f4:
      return uVar1 == 0;
    }
    if (*(int *)((long)s + lVar2) != *(int *)((long)t + lVar2)) {
      uVar1 = 1;
      goto LAB_002fa8f4;
    }
    length = length + -1;
    lVar2 = lVar2 + 4;
  } while( true );
}

Assistant:

static inline UBool
equal_uint32(const uint32_t *s, const uint32_t *t, int32_t length) {
    while(length>0 && *s==*t) {
        ++s;
        ++t;
        --length;
    }
    return (UBool)(length==0);
}